

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minReEnter(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *sel,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *maxabs,SPxId *id,int nr,bool polish)

{
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar3;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar4;
  Item *pIVar5;
  undefined8 uVar6;
  pointer pnVar7;
  pointer pnVar8;
  undefined8 uVar9;
  int32_t iVar10;
  long lVar11;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar12;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar13;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar14;
  int iVar15;
  int iVar16;
  cpp_dec_float<50U,_int,_void> *pcVar17;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar18;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar19;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar20;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> *local_128;
  int local_11c;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_118;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_98;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_58;
  cpp_dec_float<50U,_int,_void> *local_50;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_48;
  long local_40;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_38;
  
  local_168.fpclass = cpp_dec_float_finite;
  local_168.prec_elem = 10;
  local_168.data._M_elems[0] = 0;
  local_168.data._M_elems[1] = 0;
  local_168.data._M_elems[2] = 0;
  local_168.data._M_elems[3] = 0;
  local_168.data._M_elems[4] = 0;
  local_168.data._M_elems[5] = 0;
  local_168.data._M_elems._24_5_ = 0;
  local_168.data._M_elems[7]._1_3_ = 0;
  local_168.data._M_elems._32_5_ = 0;
  local_168.data._M_elems[9]._1_3_ = 0;
  local_168.exp = 0;
  local_168.neg = false;
  local_98.fpclass = cpp_dec_float_finite;
  local_98.prec_elem = 10;
  local_98.data._M_elems[0] = 0;
  local_98.data._M_elems[1] = 0;
  local_98.data._M_elems[2] = 0;
  local_98.data._M_elems[3] = 0;
  local_98.data._M_elems[4] = 0;
  local_98.data._M_elems[5] = 0;
  local_98.data._M_elems._24_5_ = 0;
  local_98.data._M_elems[7]._1_3_ = 0;
  local_98.data._M_elems._32_5_ = 0;
  local_98.data._M_elems[9]._1_3_ = 0;
  local_98.exp = 0;
  local_98.neg = false;
  pSVar2 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pUVar3 = pSVar2->thePvec;
  pUVar4 = pSVar2->theCoPvec;
  iVar15 = (id->super_DataKey).info * pSVar2->theRep;
  if (iVar15 < 0) {
    if (0 < pSVar2->theRep *
            ((pSVar2->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.costat)->data[nr]) {
      this_00 = &pUVar4->thedelta;
      goto LAB_002ba61b;
    }
    pVVar19 = pSVar2->theCoUbound;
    pVVar13 = pSVar2->theCoLbound;
    pnVar7 = (pUVar4->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_168.data._M_elems._32_5_ = SUB85(*(undefined8 *)((long)(pnVar7 + nr) + 0x20),0);
    local_168.data._M_elems[9]._1_3_ =
         (undefined3)((ulong)*(undefined8 *)((long)(pnVar7 + nr) + 0x20) >> 0x28);
    local_168.data._M_elems._0_8_ = *(undefined8 *)&pnVar7[nr].m_backend;
    local_168.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar7[nr].m_backend + 8);
    local_168.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar7 + nr) + 0x10);
    uVar6 = *(undefined8 *)((long)(pnVar7 + nr) + 0x18);
    local_168.data._M_elems._24_5_ = SUB85(uVar6,0);
    local_168.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_168.exp = *(int *)((long)(pnVar7 + nr) + 0x28);
    local_168.neg = *(bool *)((long)(pnVar7 + nr) + 0x2c);
    local_168._48_8_ = *(undefined8 *)((long)(pnVar7 + nr) + 0x30);
    pnVar7 = (pUVar4->thedelta).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_98.exp = pnVar7[nr].m_backend.exp;
    local_98.neg = pnVar7[nr].m_backend.neg;
    local_98.fpclass = pnVar7[nr].m_backend.fpclass;
    local_98.prec_elem = pnVar7[nr].m_backend.prec_elem;
    local_98.data._M_elems._0_8_ = *(undefined8 *)&pnVar7[nr].m_backend.data;
    local_98.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar7[nr].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar7[nr].m_backend.data + 0x10);
    local_98.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar9 = *(undefined8 *)(puVar1 + 2);
    uVar6 = *(undefined8 *)((long)&pnVar7[nr].m_backend.data + 0x20);
    local_98.data._M_elems._32_5_ = SUB85(uVar6,0);
    local_98.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_98.data._M_elems._24_5_ = SUB85(uVar9,0);
    local_98.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
    local_128 = &sel->m_backend;
    local_50 = &maxabs->m_backend;
    if (local_98.fpclass == cpp_dec_float_NaN) {
LAB_002ba8b2:
      pVVar14 = ((this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver)->theCoUbound;
    }
    else {
      local_d8.fpclass = cpp_dec_float_finite;
      local_d8.prec_elem = 10;
      local_d8.data._M_elems[0] = 0;
      local_d8.data._M_elems[1] = 0;
      local_d8.data._M_elems[2] = 0;
      local_d8.data._M_elems[3] = 0;
      local_d8.data._M_elems[4] = 0;
      local_d8.data._M_elems[5] = 0;
      local_d8.data._M_elems._24_5_ = 0;
      local_d8.data._M_elems[7]._1_3_ = 0;
      local_d8.data._M_elems._32_5_ = 0;
      local_d8.data._M_elems[9]._1_3_ = 0;
      local_d8.exp = 0;
      local_d8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_d8,0.0);
      iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_98,&local_d8);
      if (iVar15 < 1) goto LAB_002ba8b2;
      pVVar14 = ((this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver)->theCoLbound;
    }
    pNVar18 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pVVar14->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + nr);
    pNVar20 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pUVar4->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + nr);
    local_118.val.m_backend.fpclass = cpp_dec_float_finite;
    local_118.val.m_backend.prec_elem = 10;
    local_118.val.m_backend.data._M_elems[0] = 0;
    local_118.val.m_backend.data._M_elems[1] = 0;
    local_118.val.m_backend.data._M_elems[2] = 0;
    local_118.val.m_backend.data._M_elems[3] = 0;
    local_118.val.m_backend.data._M_elems[4] = 0;
    local_118.val.m_backend.data._M_elems[5] = 0;
    local_118.val.m_backend.data._M_elems._24_5_ = 0;
    local_118.val.m_backend.data._M_elems[7]._1_3_ = 0;
    local_118.val.m_backend.data._M_elems._32_5_ = 0;
    local_118.val.m_backend.data._M_elems[9]._1_3_ = 0;
    local_118.val.m_backend.exp = 0;
    local_118.val.m_backend.neg = false;
    if (&local_118 == pNVar20) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)&local_118,
                 (cpp_dec_float<50U,_int,_void> *)pNVar18);
      if (local_118.val.m_backend.data._M_elems[0] != 0 ||
          local_118.val.m_backend.fpclass != cpp_dec_float_finite) {
        local_118.val.m_backend.neg = (bool)(local_118.val.m_backend.neg ^ 1);
      }
    }
    else {
      if (&local_118 != pNVar18) {
        uVar6 = *(undefined8 *)((long)(pNVar18->val).m_backend.data._M_elems + 0x20);
        local_118.val.m_backend.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_118.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_118.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(pNVar18->val).m_backend.data._M_elems;
        local_118.val.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)(pNVar18->val).m_backend.data._M_elems + 8);
        local_118.val.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((long)(pNVar18->val).m_backend.data._M_elems + 0x10);
        uVar6 = *(undefined8 *)((long)(pNVar18->val).m_backend.data._M_elems + 0x18);
        local_118.val.m_backend.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_118.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_118.val.m_backend.exp = *(int *)((long)&(pNVar18->val).m_backend + 0x28);
        local_118.val.m_backend.neg = *(bool *)((long)&(pNVar18->val).m_backend + 0x2c);
        local_118.val.m_backend._48_8_ = *(undefined8 *)((long)&(pNVar18->val).m_backend + 0x30);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)&local_118,
                 (cpp_dec_float<50U,_int,_void> *)pNVar20);
    }
    local_d8.fpclass = cpp_dec_float_finite;
    local_d8.prec_elem = 10;
    local_d8.data._M_elems[0] = 0;
    local_d8.data._M_elems[1] = 0;
    local_d8.data._M_elems[2] = 0;
    local_d8.data._M_elems[3] = 0;
    local_d8.data._M_elems[4] = 0;
    local_d8.data._M_elems[5] = 0;
    local_d8.data._M_elems._24_5_ = 0;
    local_d8.data._M_elems[7]._1_3_ = 0;
    local_d8.data._M_elems._32_5_ = 0;
    local_d8.data._M_elems[9]._1_3_ = 0;
    local_d8.exp = 0;
    local_d8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_d8,(cpp_dec_float<50U,_int,_void> *)&local_118,&local_98);
    *(ulong *)((local_128->data)._M_elems + 8) =
         CONCAT35(local_d8.data._M_elems[9]._1_3_,local_d8.data._M_elems._32_5_);
    *(undefined8 *)((local_128->data)._M_elems + 4) = local_d8.data._M_elems._16_8_;
    *(ulong *)((local_128->data)._M_elems + 6) =
         CONCAT35(local_d8.data._M_elems[7]._1_3_,local_d8.data._M_elems._24_5_);
    *(undefined8 *)(local_128->data)._M_elems = local_d8.data._M_elems._0_8_;
    *(undefined8 *)((local_128->data)._M_elems + 2) = local_d8.data._M_elems._8_8_;
    local_128->exp = local_d8.exp;
    local_128->neg = local_d8.neg;
    local_128->fpclass = local_d8.fpclass;
    local_128->prec_elem = local_d8.prec_elem;
    pcVar17 = local_128;
    goto LAB_002baa72;
  }
  if (iVar15 == 0) {
    return true;
  }
  pVVar19 = pSVar2->theUbound;
  local_58 = pSVar2->theLbound;
  pIVar5 = (pSVar2->thevectors->set).theitem;
  local_40 = (long)nr;
  iVar15 = (pSVar2->thevectors->set).thekey[local_40].idx;
  local_d8.fpclass = cpp_dec_float_finite;
  local_d8.prec_elem = 10;
  local_d8.data._M_elems[0] = 0;
  local_d8.data._M_elems[1] = 0;
  local_d8.data._M_elems[2] = 0;
  local_d8.data._M_elems[3] = 0;
  local_d8.data._M_elems[4] = 0;
  local_d8.data._M_elems[5] = 0;
  local_d8.data._M_elems._24_5_ = 0;
  local_d8.data._M_elems[7]._1_3_ = 0;
  local_d8.data._M_elems._32_5_ = 0;
  local_d8.data._M_elems[9]._1_3_ = 0;
  local_d8.exp = 0;
  local_d8.neg = false;
  iVar16 = pIVar5[iVar15].data.
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .memused;
  local_128 = &sel->m_backend;
  local_11c = nr;
  local_50 = &maxabs->m_backend;
  local_48 = &pUVar3->thedelta;
  local_38 = this;
  if (0 < iVar16) {
    pNVar20 = pIVar5[iVar15].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem;
    iVar16 = iVar16 + 1;
    do {
      pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((pUVar4->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + pNVar20->idx);
      local_118.val.m_backend.fpclass = cpp_dec_float_finite;
      local_118.val.m_backend.prec_elem = 10;
      local_118.val.m_backend.data._M_elems[0] = 0;
      local_118.val.m_backend.data._M_elems[1] = 0;
      local_118.val.m_backend.data._M_elems[2] = 0;
      local_118.val.m_backend.data._M_elems[3] = 0;
      local_118.val.m_backend.data._M_elems[4] = 0;
      local_118.val.m_backend.data._M_elems[5] = 0;
      local_118.val.m_backend.data._M_elems._24_5_ = 0;
      local_118.val.m_backend.data._M_elems[7]._1_3_ = 0;
      local_118.val.m_backend.data._M_elems._32_5_ = 0;
      local_118.val.m_backend.data._M_elems[9]._1_3_ = 0;
      local_118.val.m_backend.exp = 0;
      local_118.val.m_backend.neg = false;
      pNVar18 = pNVar20;
      if ((&local_118 != pNVar12) && (pNVar18 = pNVar12, pNVar20 != &local_118)) {
        uVar6 = *(undefined8 *)((pNVar20->val).m_backend.data._M_elems + 8);
        local_118.val.m_backend.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_118.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_118.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(pNVar20->val).m_backend.data._M_elems;
        local_118.val.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((pNVar20->val).m_backend.data._M_elems + 2);
        local_118.val.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((pNVar20->val).m_backend.data._M_elems + 4);
        uVar6 = *(undefined8 *)((pNVar20->val).m_backend.data._M_elems + 6);
        local_118.val.m_backend.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_118.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_118.val.m_backend.exp = (pNVar20->val).m_backend.exp;
        local_118.val.m_backend.neg = (pNVar20->val).m_backend.neg;
        local_118.val.m_backend.fpclass = (pNVar20->val).m_backend.fpclass;
        local_118.val.m_backend.prec_elem = (pNVar20->val).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                ((cpp_dec_float<50U,_int,_void> *)&local_118,
                 (cpp_dec_float<50U,_int,_void> *)pNVar18);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_d8,(cpp_dec_float<50U,_int,_void> *)&local_118);
      pNVar20 = pNVar20 + 1;
      iVar16 = iVar16 + -1;
    } while (1 < iVar16);
  }
  this = local_38;
  lVar11 = local_40;
  nr = local_11c;
  local_118.val.m_backend.data._M_elems._32_5_ = local_d8.data._M_elems._32_5_;
  local_118.val.m_backend.data._M_elems[9]._1_3_ = local_d8.data._M_elems[9]._1_3_;
  local_118.val.m_backend.data._M_elems[4] = local_d8.data._M_elems[4];
  local_118.val.m_backend.data._M_elems[5] = local_d8.data._M_elems[5];
  local_118.val.m_backend.data._M_elems._24_5_ = local_d8.data._M_elems._24_5_;
  local_118.val.m_backend.data._M_elems[7]._1_3_ = local_d8.data._M_elems[7]._1_3_;
  local_118.val.m_backend.data._M_elems[0] = local_d8.data._M_elems[0];
  local_118.val.m_backend.data._M_elems[1] = local_d8.data._M_elems[1];
  local_118.val.m_backend.data._M_elems[2] = local_d8.data._M_elems[2];
  local_118.val.m_backend.data._M_elems[3] = local_d8.data._M_elems[3];
  pnVar7 = (pUVar3->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)((long)(pnVar7 + local_40) + 0x20) =
       CONCAT35(local_d8.data._M_elems[9]._1_3_,local_d8.data._M_elems._32_5_);
  *(undefined8 *)((long)(pnVar7 + local_40) + 0x10) = local_d8.data._M_elems._16_8_;
  *(ulong *)((long)(pnVar7 + local_40) + 0x18) =
       CONCAT35(local_d8.data._M_elems[7]._1_3_,local_d8.data._M_elems._24_5_);
  *(undefined8 *)&pnVar7[local_40].m_backend = local_d8.data._M_elems._0_8_;
  *(undefined8 *)((long)&pnVar7[local_40].m_backend + 8) = local_d8.data._M_elems._8_8_;
  *(int *)((long)(pnVar7 + local_40) + 0x28) = local_d8.exp;
  *(bool *)((long)(pnVar7 + local_40) + 0x2c) = local_d8.neg;
  *(undefined8 *)((long)(pnVar7 + local_40) + 0x30) = local_d8._48_8_;
  pSVar2 = (local_38->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  this_00 = local_48;
  if (0 < pSVar2->theRep *
          ((pSVar2->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.stat)->data[local_40]) {
LAB_002ba61b:
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clearIdx(this_00,nr);
    return true;
  }
  pnVar7 = (pUVar3->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_168.data._M_elems._32_5_ = SUB85(*(undefined8 *)((long)(pnVar7 + local_40) + 0x20),0);
  local_168.data._M_elems[9]._1_3_ =
       (undefined3)((ulong)*(undefined8 *)((long)(pnVar7 + local_40) + 0x20) >> 0x28);
  local_168.data._M_elems._0_8_ = *(undefined8 *)&pnVar7[local_40].m_backend;
  local_168.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar7[local_40].m_backend + 8);
  local_168.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar7 + local_40) + 0x10);
  uVar6 = *(undefined8 *)((long)(pnVar7 + local_40) + 0x18);
  local_168.data._M_elems._24_5_ = SUB85(uVar6,0);
  local_168.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
  local_168.exp = *(int *)((long)(pnVar7 + local_40) + 0x28);
  local_168.neg = *(bool *)((long)(pnVar7 + local_40) + 0x2c);
  local_168._48_8_ = *(undefined8 *)((long)(pnVar7 + local_40) + 0x30);
  pnVar7 = (pUVar3->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_98.exp = pnVar7[local_40].m_backend.exp;
  local_98.neg = pnVar7[local_40].m_backend.neg;
  local_98.fpclass = pnVar7[local_40].m_backend.fpclass;
  local_98.prec_elem = pnVar7[local_40].m_backend.prec_elem;
  local_98.data._M_elems._0_8_ = *(undefined8 *)&pnVar7[local_40].m_backend.data;
  local_98.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar7[local_40].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar7[local_40].m_backend.data + 0x10);
  local_98.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  uVar9 = *(undefined8 *)(puVar1 + 2);
  uVar6 = *(undefined8 *)((long)&pnVar7[local_40].m_backend.data + 0x20);
  local_98.data._M_elems._32_5_ = SUB85(uVar6,0);
  local_98.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
  local_98.data._M_elems._24_5_ = SUB85(uVar9,0);
  local_98.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
  if (local_98.fpclass == cpp_dec_float_NaN) {
LAB_002ba82e:
    pVVar13 = ((this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver)->theUbound;
  }
  else {
    local_d8.fpclass = cpp_dec_float_finite;
    local_d8.prec_elem = 10;
    local_d8.data._M_elems[0] = 0;
    local_d8.data._M_elems[1] = 0;
    local_d8.data._M_elems[2] = 0;
    local_d8.data._M_elems[3] = 0;
    local_d8.data._M_elems[4] = 0;
    local_d8.data._M_elems[5] = 0;
    local_d8.data._M_elems._24_5_ = 0;
    local_d8.data._M_elems[7]._1_3_ = 0;
    local_d8.data._M_elems._32_5_ = 0;
    local_d8.data._M_elems[9]._1_3_ = 0;
    local_d8.exp = 0;
    local_d8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_d8,0.0);
    iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_98,&local_d8);
    if (iVar15 < 1) goto LAB_002ba82e;
    pVVar13 = ((this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver)->theLbound;
  }
  pcVar17 = local_128;
  pNVar20 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)((pVVar13->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar11);
  pNVar18 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)((pUVar3->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar11);
  local_118.val.m_backend.fpclass = cpp_dec_float_finite;
  local_118.val.m_backend.prec_elem = 10;
  local_118.val.m_backend.data._M_elems[0] = 0;
  local_118.val.m_backend.data._M_elems[1] = 0;
  local_118.val.m_backend.data._M_elems[2] = 0;
  local_118.val.m_backend.data._M_elems[3] = 0;
  local_118.val.m_backend.data._M_elems[4] = 0;
  local_118.val.m_backend.data._M_elems[5] = 0;
  local_118.val.m_backend.data._M_elems._24_5_ = 0;
  local_118.val.m_backend.data._M_elems[7]._1_3_ = 0;
  local_118.val.m_backend.data._M_elems._32_5_ = 0;
  local_118.val.m_backend.data._M_elems[9]._1_3_ = 0;
  local_118.val.m_backend.exp = 0;
  local_118.val.m_backend.neg = false;
  if (&local_118 == pNVar18) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)&local_118,(cpp_dec_float<50U,_int,_void> *)pNVar20)
    ;
    if (local_118.val.m_backend.data._M_elems[0] != 0 ||
        local_118.val.m_backend.fpclass != cpp_dec_float_finite) {
      local_118.val.m_backend.neg = (bool)(local_118.val.m_backend.neg ^ 1);
    }
  }
  else {
    if (&local_118 != pNVar20) {
      uVar6 = *(undefined8 *)((long)(pNVar20->val).m_backend.data._M_elems + 0x20);
      local_118.val.m_backend.data._M_elems._32_5_ = SUB85(uVar6,0);
      local_118.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_118.val.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)(pNVar20->val).m_backend.data._M_elems;
      local_118.val.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)(pNVar20->val).m_backend.data._M_elems + 8);
      local_118.val.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((long)(pNVar20->val).m_backend.data._M_elems + 0x10);
      uVar6 = *(undefined8 *)((long)(pNVar20->val).m_backend.data._M_elems + 0x18);
      local_118.val.m_backend.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_118.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_118.val.m_backend.exp = *(int *)((long)&(pNVar20->val).m_backend + 0x28);
      local_118.val.m_backend.neg = *(bool *)((long)&(pNVar20->val).m_backend + 0x2c);
      local_118.val.m_backend._48_8_ = *(undefined8 *)((long)&(pNVar20->val).m_backend + 0x30);
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)&local_118,(cpp_dec_float<50U,_int,_void> *)pNVar18)
    ;
  }
  local_d8.fpclass = cpp_dec_float_finite;
  local_d8.prec_elem = 10;
  local_d8.data._M_elems[0] = 0;
  local_d8.data._M_elems[1] = 0;
  local_d8.data._M_elems[2] = 0;
  local_d8.data._M_elems[3] = 0;
  local_d8.data._M_elems[4] = 0;
  local_d8.data._M_elems[5] = 0;
  local_d8.data._M_elems._24_5_ = 0;
  local_d8.data._M_elems[7]._1_3_ = 0;
  local_d8.data._M_elems._32_5_ = 0;
  local_d8.data._M_elems[9]._1_3_ = 0;
  local_d8.exp = 0;
  local_d8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_d8,(cpp_dec_float<50U,_int,_void> *)&local_118,&local_98);
  *(ulong *)((pcVar17->data)._M_elems + 8) =
       CONCAT35(local_d8.data._M_elems[9]._1_3_,local_d8.data._M_elems._32_5_);
  *(undefined8 *)((pcVar17->data)._M_elems + 4) = local_d8.data._M_elems._16_8_;
  *(ulong *)((pcVar17->data)._M_elems + 6) =
       CONCAT35(local_d8.data._M_elems[7]._1_3_,local_d8.data._M_elems._24_5_);
  *(undefined8 *)(pcVar17->data)._M_elems = local_d8.data._M_elems._0_8_;
  *(undefined8 *)((pcVar17->data)._M_elems + 2) = local_d8.data._M_elems._8_8_;
  pcVar17->exp = local_d8.exp;
  pcVar17->neg = local_d8.neg;
  pcVar17->fpclass = local_d8.fpclass;
  pcVar17->prec_elem = local_d8.prec_elem;
  pVVar13 = local_58;
LAB_002baa72:
  pnVar7 = (pVVar19->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((pnVar7[nr].m_backend.fpclass == cpp_dec_float_NaN) ||
      (pnVar8 = (pVVar13->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      pnVar8[nr].m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&pnVar7[nr].m_backend,&pnVar8[nr].m_backend), iVar15 != 0)) {
    local_d8.fpclass = cpp_dec_float_finite;
    local_d8.prec_elem = 10;
    local_d8.data._M_elems[0] = 0;
    local_d8.data._M_elems[1] = 0;
    local_d8.data._M_elems[2] = 0;
    local_d8.data._M_elems[3] = 0;
    local_d8.data._M_elems[4] = 0;
    local_d8.data._M_elems[5] = 0;
    local_d8.data._M_elems._24_5_ = 0;
    local_d8.data._M_elems[7]._1_3_ = 0;
    local_d8.data._M_elems._32_5_ = 0;
    local_d8.data._M_elems[9]._1_3_ = 0;
    local_d8.exp = 0;
    local_d8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_d8,&(this->fastDelta).m_backend,local_50);
    if (((pcVar17->fpclass != cpp_dec_float_NaN) && (local_d8.fpclass != cpp_dec_float_NaN)) &&
       ((iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (pcVar17,&local_d8), 0 < iVar15 &&
        (boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                   ((cpp_dec_float<50u,int,void> *)pcVar17,0.0), !polish)))) {
      if (local_98.fpclass != cpp_dec_float_NaN) {
        local_d8.fpclass = cpp_dec_float_finite;
        local_d8.prec_elem = 10;
        local_d8.data._M_elems[0] = 0;
        local_d8.data._M_elems[1] = 0;
        local_d8.data._M_elems[2] = 0;
        local_d8.data._M_elems[3] = 0;
        local_d8.data._M_elems[4] = 0;
        local_d8.data._M_elems[5] = 0;
        local_d8.data._M_elems._24_5_ = 0;
        local_d8.data._M_elems[7]._1_3_ = 0;
        local_d8.data._M_elems._32_5_ = 0;
        local_d8.data._M_elems[9]._1_3_ = 0;
        local_d8.exp = 0;
        local_d8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_d8,0.0);
        iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_98,&local_d8);
        if (iVar15 < 0) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&(((this->
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->theShift).m_backend,
                     &(pVVar19->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[nr].m_backend);
          pnVar7 = (pVVar19->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)&pnVar7[nr].m_backend.data = local_168.data._M_elems._0_8_;
          *(undefined8 *)((long)&pnVar7[nr].m_backend.data + 8) = local_168.data._M_elems._8_8_;
          puVar1 = (uint *)((long)&pnVar7[nr].m_backend.data + 0x10);
          *(undefined8 *)puVar1 = local_168.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_168.data._M_elems[7]._1_3_,local_168.data._M_elems._24_5_);
          *(ulong *)((long)&pnVar7[nr].m_backend.data + 0x20) =
               CONCAT35(local_168.data._M_elems[9]._1_3_,local_168.data._M_elems._32_5_);
          pnVar7[nr].m_backend.exp = local_168.exp;
          pnVar7[nr].m_backend.neg = local_168.neg;
          pnVar7[nr].m_backend.fpclass = local_168.fpclass;
          pnVar7[nr].m_backend.prec_elem = local_168.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&(((this->
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->theShift).m_backend,
                     &(pVVar19->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[nr].m_backend);
          return false;
        }
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&(((this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->theShift).m_backend,
                 &(pVVar13->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[nr].m_backend);
      pnVar7 = (pVVar13->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)&pnVar7[nr].m_backend.data = local_168.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar7[nr].m_backend.data + 8) = local_168.data._M_elems._8_8_;
      puVar1 = (uint *)((long)&pnVar7[nr].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_168.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_168.data._M_elems[7]._1_3_,local_168.data._M_elems._24_5_);
      *(ulong *)((long)&pnVar7[nr].m_backend.data + 0x20) =
           CONCAT35(local_168.data._M_elems[9]._1_3_,local_168.data._M_elems._32_5_);
      pnVar7[nr].m_backend.exp = local_168.exp;
      pnVar7[nr].m_backend.neg = local_168.neg;
      pnVar7[nr].m_backend.fpclass = local_168.fpclass;
      pnVar7[nr].m_backend.prec_elem = local_168.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&(((this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->theShift).m_backend,
                 &(pVVar13->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[nr].m_backend);
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)pcVar17,0.0);
    if (!polish) {
      if (((local_168.fpclass == cpp_dec_float_NaN) ||
          (pnVar7 = (pVVar19->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          pnVar7[nr].m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_168,&pnVar7[nr].m_backend), iVar15 < 1)) {
        pcVar17 = &(pVVar13->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[nr].m_backend;
        local_d8.fpclass = cpp_dec_float_finite;
        local_d8.prec_elem = 10;
        local_d8.data._M_elems[0] = 0;
        local_d8.data._M_elems[1] = 0;
        local_d8.data._M_elems[2] = 0;
        local_d8.data._M_elems[3] = 0;
        local_d8.data._M_elems[4] = 0;
        local_d8.data._M_elems[5] = 0;
        local_d8.data._M_elems._24_5_ = 0;
        local_d8.data._M_elems[7]._1_3_ = 0;
        local_d8.data._M_elems._32_5_ = 0;
        local_d8.data._M_elems[9]._1_3_ = 0;
        local_d8.exp = 0;
        local_d8.neg = false;
        if (&local_d8 != pcVar17) {
          uVar6 = *(undefined8 *)((pcVar17->data)._M_elems + 8);
          local_d8.data._M_elems._32_5_ = SUB85(uVar6,0);
          local_d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_d8.data._M_elems._0_8_ = *(undefined8 *)(pcVar17->data)._M_elems;
          local_d8.data._M_elems._8_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 2);
          local_d8.data._M_elems._16_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 4);
          uVar6 = *(undefined8 *)((pcVar17->data)._M_elems + 6);
          local_d8.data._M_elems._24_5_ = SUB85(uVar6,0);
          local_d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_d8.exp = pcVar17->exp;
          local_d8.neg = pcVar17->neg;
          local_d8.fpclass = pcVar17->fpclass;
          local_d8.prec_elem = pcVar17->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_d8,&local_168);
        pSVar2 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
      }
      else {
        pcVar17 = &(pVVar19->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[nr].m_backend;
        local_d8.fpclass = cpp_dec_float_finite;
        local_d8.prec_elem = 10;
        local_d8.data._M_elems[0] = 0;
        local_d8.data._M_elems[1] = 0;
        local_d8.data._M_elems[2] = 0;
        local_d8.data._M_elems[3] = 0;
        local_d8.data._M_elems[4] = 0;
        local_d8.data._M_elems[5] = 0;
        local_d8.data._M_elems._24_5_ = 0;
        local_d8.data._M_elems[7]._1_3_ = 0;
        local_d8.data._M_elems._32_5_ = 0;
        local_d8.data._M_elems[9]._1_3_ = 0;
        local_d8.exp = 0;
        local_d8.neg = false;
        if (&local_d8 == pcVar17) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_d8,&local_168);
          if (local_d8.data._M_elems[0] != 0 || local_d8.fpclass != cpp_dec_float_finite) {
            local_d8.neg = (bool)(local_d8.neg ^ 1);
          }
        }
        else {
          local_d8.data._M_elems._32_5_ = local_168.data._M_elems._32_5_;
          local_d8.data._M_elems[9]._1_3_ = local_168.data._M_elems[9]._1_3_;
          local_d8.data._M_elems[4] = local_168.data._M_elems[4];
          local_d8.data._M_elems[5] = local_168.data._M_elems[5];
          local_d8.data._M_elems._24_5_ = local_168.data._M_elems._24_5_;
          local_d8.data._M_elems[7]._1_3_ = local_168.data._M_elems[7]._1_3_;
          local_d8.data._M_elems[0] = local_168.data._M_elems[0];
          local_d8.data._M_elems[1] = local_168.data._M_elems[1];
          local_d8.data._M_elems[2] = local_168.data._M_elems[2];
          local_d8.data._M_elems[3] = local_168.data._M_elems[3];
          local_d8.exp = local_168.exp;
          local_d8.neg = local_168.neg;
          local_d8.fpclass = local_168.fpclass;
          local_d8.prec_elem = local_168.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_d8,pcVar17);
        }
        pSVar2 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&(pSVar2->theShift).m_backend,&local_d8);
      pnVar7 = (pVVar13->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)&pnVar7[nr].m_backend.data + 0x20) =
           CONCAT35(local_168.data._M_elems[9]._1_3_,local_168.data._M_elems._32_5_);
      puVar1 = (uint *)((long)&pnVar7[nr].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_168.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_168.data._M_elems[7]._1_3_,local_168.data._M_elems._24_5_);
      *(undefined8 *)&pnVar7[nr].m_backend.data = local_168.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar7[nr].m_backend.data + 8) = local_168.data._M_elems._8_8_;
      pnVar7[nr].m_backend.exp = local_168.exp;
      pnVar7[nr].m_backend.neg = local_168.neg;
      pnVar7[nr].m_backend.fpclass = local_168.fpclass;
      pnVar7[nr].m_backend.prec_elem = local_168.prec_elem;
      pnVar8 = (pVVar19->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)&pnVar8[nr].m_backend.data + 0x20) =
           CONCAT35(local_168.data._M_elems[9]._1_3_,local_168.data._M_elems._32_5_);
      puVar1 = (uint *)((long)&pnVar8[nr].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_168.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_168.data._M_elems[7]._1_3_,local_168.data._M_elems._24_5_);
      *(undefined8 *)&pnVar8[nr].m_backend.data = local_168.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar8[nr].m_backend.data + 8) = local_168.data._M_elems._8_8_;
      pnVar8[nr].m_backend.exp = pnVar7[nr].m_backend.exp;
      pnVar8[nr].m_backend.neg = pnVar7[nr].m_backend.neg;
      iVar10 = pnVar7[nr].m_backend.prec_elem;
      pnVar8[nr].m_backend.fpclass = pnVar7[nr].m_backend.fpclass;
      pnVar8[nr].m_backend.prec_elem = iVar10;
    }
  }
  return false;
}

Assistant:

bool SPxFastRT<R>::minReEnter(
   R& sel,
   R maxabs,
   const SPxId& id,
   int nr,
   bool polish)
{
   R x, d;
   VectorBase<R>* up;
   VectorBase<R>* low;

   UpdateVector<R>& pvec = this->thesolver->pVec();
   SSVectorBase<R>& pupd = this->thesolver->pVec().delta();
   VectorBase<R>& upb = this->thesolver->upBound();
   VectorBase<R>& lpb = this->thesolver->lpBound();
   UpdateVector<R>& cvec = this->thesolver->coPvec();
   SSVectorBase<R>& cupd = this->thesolver->coPvec().delta();
   VectorBase<R>& ucb = this->thesolver->ucBound();
   VectorBase<R>& lcb = this->thesolver->lcBound();

   if(this->thesolver->isCoId(id))
   {
      if(this->thesolver->isCoBasic(nr))
      {
         cupd.clearIdx(nr);
         return true;
      }

      x = cvec[nr];
      d = cupd[nr];
      up = &ucb;
      low = &lcb;

      if(d > 0.0)
         sel = (this->thesolver->lcBound()[nr] - cvec[nr]) / d;
      else
         sel = (this->thesolver->ucBound()[nr] - cvec[nr]) / d;
   }

   else if(this->thesolver->isId(id))
   {
      pvec[nr] = this->thesolver->vector(nr) * cvec;

      if(this->thesolver->isBasic(nr))
      {
         pupd.clearIdx(nr);
         return true;
      }

      x = pvec[nr];
      d = pupd[nr];
      up = &upb;
      low = &lpb;

      if(d > 0.0)
         sel = (this->thesolver->lpBound()[nr] - pvec[nr]) / d;
      else
         sel = (this->thesolver->upBound()[nr] - pvec[nr]) / d;
   }

   else
      return true;

   if((*up)[nr] != (*low)[nr])
   {
      if(sel > fastDelta / maxabs)
      {
         sel = 0.0;

         // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         if(!polish)
         {
            if(d < 0.0)
            {
               this->thesolver->theShift -= (*up)[nr];
               (*up)[nr] = x;
               this->thesolver->theShift += (*up)[nr];
            }
            else
            {
               this->thesolver->theShift += (*low)[nr];
               (*low)[nr] = x;
               this->thesolver->theShift -= (*low)[nr];
            }
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         if(x > (*up)[nr])
            this->thesolver->theShift += x - (*up)[nr];
         else
            this->thesolver->theShift += (*low)[nr] - x;

         (*up)[nr] = (*low)[nr] = x;
      }
   }

   return false;
}